

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O2

void __thiscall helics::apps::zmqBrokerServer::processArgs(zmqBrokerServer *this,string_view args)

{
  App parser;
  allocator<char> local_4a0 [32];
  allocator<char> local_480 [32];
  basic_string_view<char,_std::char_traits<char>_> local_460;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  App local_370;
  
  local_460._M_str = args._M_str;
  local_460._M_len = args._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"zmq broker server parser",local_4a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",local_480);
  CLI::App::App(&local_370,&local_390,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  local_370.allow_extras_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"--zmq_port",local_4a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"specify the zmq port to use",local_480);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (&local_370,&local_3d0,&this->mZmqPort,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"--zmq_interface",local_4a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,
             "specify the interface to use for connecting the zmq broker server",local_480);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_370,&local_410,&this->mZmqInterface,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_450,&local_460,local_4a0);
  CLI::App::parse(&local_370,&local_450,false);
  std::__cxx11::string::~string((string *)&local_450);
  CLI::App::~App(&local_370);
  return;
}

Assistant:

void zmqBrokerServer::processArgs(std::string_view args)

{
    CLI::App parser("zmq broker server parser");
    parser.allow_extras();
    parser.add_option("--zmq_port", mZmqPort, "specify the zmq port to use");
    parser.add_option("--zmq_interface",
                      mZmqInterface,
                      "specify the interface to use for connecting the zmq broker server");

    try {
        parser.parse(std::string(args));
    }
    catch (const CLI::Error& ce) {
        logMessage(std::string("error processing command line arguments for web server :") +
                   ce.what());
    }
}